

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O3

milliseconds checkInterval(char *caller,milliseconds interval)

{
  long in_FS_OFFSET;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (interval.__r < 0) {
    local_28.context.version = 2;
    local_28.context._4_8_ = 0;
    local_28.context._12_8_ = 0;
    local_28.context.function._4_4_ = 0;
    local_28.context.category = "default";
    QMessageLogger::warning
              (&local_28,"%s: negative intervals aren\'t allowed; the interval will be set to 1ms.",
               caller);
    interval.__r = 1;
  }
  else if ((ulong)interval.__r >> 0x1f != 0) {
    local_28.context.version = 2;
    local_28.context._4_8_ = 0;
    local_28.context._12_8_ = 0;
    local_28.context.function._4_4_ = 0;
    local_28.context.category = "default";
    QMessageLogger::warning
              (&local_28,
               "%s: interval exceeds maximum allowed interval, it will be clamped to INT_MAX ms (about 24 days)."
               ,caller);
    interval.__r = 0x7fffffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (milliseconds)interval.__r;
  }
  __stack_chk_fail();
}

Assistant:

static std::chrono::milliseconds
checkInterval(const char *caller, std::chrono::milliseconds interval)
{
    constexpr auto maxInterval = INT_MAX * 1ms;
    if (interval < 0ms) {
        qWarning("%s: negative intervals aren't allowed; the interval will be set to 1ms.", caller);
        interval = 1ms;
    } else if (interval > maxInterval) {
        qWarning("%s: interval exceeds maximum allowed interval, it will be clamped to "
                 "INT_MAX ms (about 24 days).", caller);
        interval = maxInterval;
    }
    return interval;
}